

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O0

sunrealtype doubleIntgr(N_Vector c,int i,WebData wdata)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  double dVar7;
  int jy;
  int jx;
  sunrealtype intgr_x;
  sunrealtype intgr_xy;
  sunrealtype dy;
  sunrealtype dx;
  int mxns;
  int my;
  int mx;
  int ns;
  sunrealtype *cdata;
  undefined4 local_58;
  undefined4 local_54;
  undefined8 local_50;
  undefined8 local_48;
  
  lVar6 = N_VGetArrayPointer(in_RDI);
  iVar2 = *(int *)(in_RDX + 0x40);
  iVar3 = *(int *)(in_RDX + 0x50);
  iVar4 = *(int *)(in_RDX + 0x44);
  dVar1 = *(double *)(in_RDX + 0x310);
  local_50 = *(double *)(lVar6 + (long)(in_ESI + -1) * 8);
  for (local_54 = 1; local_54 < iVar3 + -1; local_54 = local_54 + 1) {
    dVar7 = *(double *)(lVar6 + (long)(in_ESI + -1 + local_54 * iVar2) * 8);
    local_50 = dVar7 + dVar7 + local_50;
  }
  local_48 = dVar1 * 0.5 *
             (*(double *)(lVar6 + (long)(in_ESI + -1 + (iVar3 + -1) * iVar2) * 8) + local_50);
  for (local_58 = 1; local_58 < *(int *)(in_RDX + 0x54) + -1; local_58 = local_58 + 1) {
    local_50 = *(double *)(lVar6 + (long)(in_ESI + -1 + local_58 * iVar4) * 8);
    for (local_54 = 1; local_54 < iVar3 + -1; local_54 = local_54 + 1) {
      dVar7 = *(double *)(lVar6 + (long)(in_ESI + -1 + local_54 * iVar2 + local_58 * iVar4) * 8);
      local_50 = dVar7 + dVar7 + local_50;
    }
    dVar7 = dVar1 * 0.5 *
            (*(double *)(lVar6 + (long)(in_ESI + -1 + (iVar3 + -1) * iVar2 + local_58 * iVar4) * 8)
            + local_50);
    local_48 = dVar7 + dVar7 + local_48;
  }
  iVar5 = *(int *)(in_RDX + 0x54) + -1;
  local_50 = *(double *)(lVar6 + (long)(in_ESI + -1 + iVar5 * iVar4) * 8);
  for (local_54 = 1; local_54 < iVar3 + -1; local_54 = local_54 + 1) {
    dVar7 = *(double *)(lVar6 + (long)(in_ESI + -1 + local_54 * iVar2 + iVar5 * iVar4) * 8);
    local_50 = dVar7 + dVar7 + local_50;
  }
  return *(double *)(in_RDX + 0x318) * 0.5 *
         (dVar1 * 0.5 *
          (*(double *)(lVar6 + (long)(in_ESI + -1 + (iVar3 + -1) * iVar2 + iVar5 * iVar4) * 8) +
          local_50) + local_48);
}

Assistant:

static sunrealtype doubleIntgr(N_Vector c, int i, WebData wdata)
{
  sunrealtype* cdata;
  int ns, mx, my, mxns;
  sunrealtype dx, dy;
  sunrealtype intgr_xy, intgr_x;
  int jx, jy;

  cdata = N_VGetArrayPointer(c);

  ns   = wdata->ns;
  mx   = wdata->mx;
  my   = wdata->my;
  mxns = wdata->mxns;
  dx   = wdata->dx;
  dy   = wdata->dy;

  jy      = 0;
  intgr_x = cdata[(i - 1) + jy * mxns];
  for (jx = 1; jx < mx - 1; jx++)
  {
    intgr_x += TWO * cdata[(i - 1) + jx * ns + jy * mxns];
  }
  intgr_x += cdata[(i - 1) + (mx - 1) * ns + jy * mxns];
  intgr_x *= SUN_RCONST(0.5) * dx;

  intgr_xy = intgr_x;

  for (jy = 1; jy < my - 1; jy++)
  {
    intgr_x = cdata[(i - 1) + jy * mxns];
    for (jx = 1; jx < mx - 1; jx++)
    {
      intgr_x += TWO * cdata[(i - 1) + jx * ns + jy * mxns];
    }
    intgr_x += cdata[(i - 1) + (mx - 1) * ns + jy * mxns];
    intgr_x *= SUN_RCONST(0.5) * dx;

    intgr_xy += TWO * intgr_x;
  }

  jy      = my - 1;
  intgr_x = cdata[(i - 1) + jy * mxns];
  for (jx = 1; jx < mx - 1; jx++)
  {
    intgr_x += TWO * cdata[(i - 1) + jx * ns + jy * mxns];
  }
  intgr_x += cdata[(i - 1) + (mx - 1) * ns + jy * mxns];
  intgr_x *= SUN_RCONST(0.5) * dx;

  intgr_xy += intgr_x;

  intgr_xy *= SUN_RCONST(0.5) * dy;

  return (intgr_xy);
}